

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_Construct(CMatchFinder *p)

{
  CMatchFinder *in_RDI;
  uint j;
  UInt32 r;
  UInt32 i;
  uint local_14;
  uint local_10;
  uint local_c;
  
  in_RDI->bufferBase = (Byte *)0x0;
  in_RDI->directInput = '\0';
  in_RDI->hash = (CLzRef *)0x0;
  MatchFinder_SetDefaultSettings(in_RDI);
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    local_10 = local_c;
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      local_10 = local_10 >> 1 ^ ((local_10 & 1) - 1 ^ 0xffffffff) & 0xedb88320;
    }
    in_RDI->crc[local_c] = local_10;
  }
  return;
}

Assistant:

void MatchFinder_Construct(CMatchFinder *p)
{
  UInt32 i;
  p->bufferBase = NULL;
  p->directInput = 0;
  p->hash = NULL;
  MatchFinder_SetDefaultSettings(p);

  for (i = 0; i < 256; i++)
  {
    UInt32 r = i;
    unsigned j;
    for (j = 0; j < 8; j++)
      r = (r >> 1) ^ (kCrcPoly & ~((r & 1) - 1));
    p->crc[i] = r;
  }
}